

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O1

Entry * __thiscall
cali::Blackboard::exchange
          (Entry *__return_storage_ptr__,Blackboard *this,cali_id_t key,Entry *value,
          bool include_in_snapshots)

{
  cali_id_t cVar1;
  uint64_t uVar2;
  ulong uVar3;
  cali_id_t cVar4;
  
  cVar4 = key;
  do {
    uVar3 = (ulong)(uint)(((int)cVar4 + (int)(cVar4 / 0x3fd) * -0x3fd) * 0x20);
    cVar1 = *(cali_id_t *)((long)&this->hashtable[0].key + uVar3);
    if (cVar1 == key) break;
    cVar4 = cVar4 % 0x3fd + 1;
  } while (cVar1 != 0xffffffffffffffff);
  __return_storage_ptr__->m_node = (Node *)0x0;
  (__return_storage_ptr__->m_value).m_v.type_and_size = 0;
  (__return_storage_ptr__->m_value).m_v.value.v_uint = 0;
  if (cVar1 == key) {
    (__return_storage_ptr__->m_value).m_v.value =
         *(anon_union_8_7_33918203_for_value *)
          ((long)&this->hashtable[0].value.m_value.m_v.value + uVar3);
    uVar2 = *(uint64_t *)((long)&this->hashtable[0].value.m_value.m_v.type_and_size + uVar3);
    __return_storage_ptr__->m_node = *(Node **)((long)&this->hashtable[0].value.m_node + uVar3);
    (__return_storage_ptr__->m_value).m_v.type_and_size = uVar2;
    uVar2 = (value->m_value).m_v.type_and_size;
    *(Node **)((long)&this->hashtable[0].value.m_node + uVar3) = value->m_node;
    *(uint64_t *)((long)&this->hashtable[0].value.m_value.m_v.type_and_size + uVar3) = uVar2;
    *(anon_union_8_7_33918203_for_value *)
     ((long)&this->hashtable[0].value.m_value.m_v.value + uVar3) = (value->m_value).m_v.value;
  }
  else {
    add(this,key,value,include_in_snapshots);
  }
  LOCK();
  (this->ucount).super___atomic_base<int>._M_i = (this->ucount).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return __return_storage_ptr__;
}

Assistant:

Entry Blackboard::exchange(cali_id_t key, const Entry& value, bool include_in_snapshots)
{
    size_t I = find_existing_entry(key);
    Entry  ret;

    if (hashtable[I].key == key) {
        ret                = hashtable[I].value;
        hashtable[I].value = value;
    } else
        add(key, value, include_in_snapshots);

    ++ucount;

    return ret;
}